

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpuid_main.c
# Opt level: O0

char * affinity_mask_str_r(cpu_affinity_mask_t *affinity_mask,char *buffer,uint32_t buffer_len)

{
  bool bVar1;
  ushort local_20;
  ushort local_1e;
  _Bool do_print;
  logical_cpu_t str_index;
  logical_cpu_t mask_index;
  uint32_t buffer_len_local;
  char *buffer_local;
  cpu_affinity_mask_t *affinity_mask_local;
  
  local_1e = 0x1fff;
  local_20 = 0;
  bVar1 = false;
  while (local_20 + 1 < buffer_len) {
    if (((bVar1) || (local_1e < 4)) || (affinity_mask->__bits[local_1e] != '\0')) {
      snprintf(buffer + local_20,3,"%02X",(ulong)affinity_mask->__bits[local_1e]);
      bVar1 = true;
      local_20 = local_20 + 2;
    }
    if (local_1e == 0) break;
    local_1e = local_1e - 1;
  }
  buffer[local_20] = '\0';
  return buffer;
}

Assistant:

char* affinity_mask_str_r(cpu_affinity_mask_t* affinity_mask, char* buffer, uint32_t buffer_len)
{
	logical_cpu_t mask_index = __MASK_SETSIZE - 1;
	logical_cpu_t str_index = 0;
	bool do_print = false;

	while (((uint32_t) str_index) + 1 < buffer_len) {
		if (do_print || (mask_index < 4) || (affinity_mask->__bits[mask_index] != 0x00)) {
			snprintf(&buffer[str_index], 3, "%02X", affinity_mask->__bits[mask_index]);
			do_print = true;
			str_index += 2;
		}
		/* mask_index in unsigned, so we cannot decrement it beyond 0 */
		if (mask_index == 0)
			break;
		mask_index--;
	}
	buffer[str_index] = '\0';

	return buffer;
}